

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O3

void __thiscall cs::exception::exception(exception *this,exception *param_1)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__exception_0024cfb0;
  this->mLine = param_1->mLine;
  (this->mFile)._M_dataplus._M_p = (pointer)&(this->mFile).field_2;
  pcVar1 = (param_1->mFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mFile,pcVar1,pcVar1 + (param_1->mFile)._M_string_length);
  (this->mCode)._M_dataplus._M_p = (pointer)&(this->mCode).field_2;
  pcVar1 = (param_1->mCode)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mCode,pcVar1,pcVar1 + (param_1->mCode)._M_string_length);
  (this->mWhat)._M_dataplus._M_p = (pointer)&(this->mWhat).field_2;
  pcVar1 = (param_1->mWhat)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mWhat,pcVar1,pcVar1 + (param_1->mWhat)._M_string_length);
  (this->mStr)._M_dataplus._M_p = (pointer)&(this->mStr).field_2;
  pcVar1 = (param_1->mStr)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mStr,pcVar1,pcVar1 + (param_1->mStr)._M_string_length);
  return;
}

Assistant:

exception(const exception &) = default;